

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O1

void aom_highbd_dc_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar4._0_2_ = left[4] + *left;
  auVar4._2_2_ = left[5] + left[1];
  auVar4._4_2_ = left[6] + left[2];
  auVar4._6_2_ = left[7] + left[3];
  auVar4._8_2_ = left[4];
  auVar4._10_2_ = left[5];
  auVar4._12_2_ = left[6];
  auVar4._14_2_ = left[7];
  auVar6 = pshuflw(in_XMM2,auVar4,0xe);
  auVar5 = *(undefined1 (*) [16])above;
  auVar7 = *(undefined1 (*) [16])(above + 8);
  auVar8._0_2_ = auVar5._8_2_ + auVar5._0_2_;
  auVar8._2_2_ = auVar5._10_2_ + auVar5._2_2_;
  auVar8._4_2_ = auVar5._12_2_ + auVar5._4_2_;
  auVar8._6_2_ = auVar5._14_2_ + auVar5._6_2_;
  auVar8._8_2_ = auVar5._8_2_;
  auVar8._10_2_ = auVar5._10_2_;
  auVar8._12_2_ = auVar5._12_2_;
  auVar8._14_2_ = auVar5._14_2_;
  auVar5 = pshuflw(auVar5,auVar8,0xe);
  auVar9._0_2_ = auVar7._8_2_ + auVar7._0_2_;
  auVar9._2_2_ = auVar7._10_2_ + auVar7._2_2_;
  auVar9._4_2_ = auVar7._12_2_ + auVar7._4_2_;
  auVar9._6_2_ = auVar7._14_2_ + auVar7._6_2_;
  auVar9._8_2_ = auVar7._8_2_;
  auVar9._10_2_ = auVar7._10_2_;
  auVar9._12_2_ = auVar7._12_2_;
  auVar9._14_2_ = auVar7._14_2_;
  auVar7 = pshuflw(auVar7,auVar9,0xe);
  auVar5 = ZEXT416(((uint)(ushort)(auVar5._0_2_ + auVar8._0_2_ + auVar7._0_2_ + auVar9._0_2_ +
                                   auVar5._2_2_ + auVar8._2_2_ + auVar7._2_2_ + auVar9._2_2_) +
                    (uint)(ushort)(auVar6._2_2_ + auVar4._2_2_ + auVar6._0_2_ + auVar4._0_2_) + 0xc)
                   / 0x18);
  auVar5 = pshuflw(auVar5,auVar5,0);
  uVar3 = auVar5._0_4_;
  iVar2 = 1;
  do {
    *(undefined4 *)dst = uVar3;
    *(undefined4 *)(dst + 2) = uVar3;
    *(undefined4 *)(dst + 4) = uVar3;
    *(undefined4 *)(dst + 6) = uVar3;
    *(undefined4 *)(dst + 8) = uVar3;
    *(undefined4 *)(dst + 10) = uVar3;
    *(undefined4 *)(dst + 0xc) = uVar3;
    *(undefined4 *)(dst + 0xe) = uVar3;
    puVar1 = dst + stride;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    puVar1 = dst + stride + 8;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    puVar1 = dst + stride * 2;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    puVar1 = dst + stride * 2 + 8;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    puVar1 = dst + stride * 3;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    puVar1 = dst + stride * 3 + 8;
    *(undefined4 *)puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 2) = uVar3;
    *(undefined4 *)(puVar1 + 4) = uVar3;
    *(undefined4 *)(puVar1 + 6) = uVar3;
    dst = dst + stride * 4;
    iVar2 = iVar2 + -1;
  } while (iVar2 == 0);
  return;
}

Assistant:

void aom_highbd_dc_predictor_16x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_8(left);
  __m128i sum_above = dc_sum_16(above);
  const __m128i zero = _mm_setzero_si128();
  sum_left = _mm_unpacklo_epi16(sum_left, zero);
  sum_above = _mm_unpacklo_epi16(sum_above, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 12;
  sum32 /= 24;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 2; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
  }
}